

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  NodeRef *pNVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar62 [64];
  NodeRef *local_a50;
  undefined1 local_a18 [16];
  long local_a08;
  long local_a00;
  ulong local_9f8;
  Scene *local_9f0;
  RTCFilterFunctionNArguments args;
  float local_8c8 [4];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar51 = ZEXT1664(auVar24);
  auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar52 = ZEXT1664(auVar25);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar53 = ZEXT1664(auVar26);
  auVar24 = vmulss_avx512f(auVar24,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar27._0_4_ = auVar24._0_4_;
  auVar27._4_4_ = auVar27._0_4_;
  auVar27._8_4_ = auVar27._0_4_;
  auVar27._12_4_ = auVar27._0_4_;
  auVar24 = vmulss_avx512f(auVar25,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar38._0_4_ = auVar24._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar24 = vmulss_avx512f(auVar26,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar26._0_4_ = auVar24._0_4_;
  auVar26._4_4_ = auVar26._0_4_;
  auVar26._8_4_ = auVar26._0_4_;
  auVar26._12_4_ = auVar26._0_4_;
  local_9f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar16 = local_9f8 ^ 0x10;
  auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar54 = ZEXT1664(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar55 = ZEXT1664(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar56 = ZEXT1664(auVar24);
  auVar25 = vxorps_avx512vl(auVar27,auVar24);
  auVar57 = ZEXT1664(auVar25);
  auVar25 = vxorps_avx512vl(auVar38,auVar24);
  auVar58 = ZEXT1664(auVar25);
  auVar24 = vxorps_avx512vl(auVar26,auVar24);
  auVar59 = ZEXT1664(auVar24);
  auVar24 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar60 = ZEXT1664(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar61 = ZEXT1664(auVar24);
  auVar24 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar62 = ZEXT1664(auVar24);
  local_a50 = stack + 1;
LAB_01cbd6a8:
  do {
    pNVar19 = local_a50;
    if (pNVar19 == stack) {
LAB_01cbde4a:
      return pNVar19 != stack;
    }
    local_a50 = pNVar19 + -1;
    sVar20 = pNVar19[-1].ptr;
    while ((sVar20 & 8) == 0) {
      uVar13 = sVar20 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar37._4_4_ = uVar1;
      auVar37._0_4_ = uVar1;
      auVar37._8_4_ = uVar1;
      auVar37._12_4_ = uVar1;
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9f8),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + local_9f8));
      auVar25 = vfmadd213ps_avx512vl(auVar24,auVar51._0_16_,auVar57._0_16_);
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar15),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + uVar15));
      auVar26 = vmaxps_avx512vl(auVar54._0_16_,auVar25);
      auVar25 = vfmadd213ps_avx512vl(auVar24,auVar52._0_16_,auVar58._0_16_);
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar21),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + uVar21));
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar53._0_16_,auVar59._0_16_);
      auVar24 = vmaxps_avx(auVar25,auVar24);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar16),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + uVar16));
      auVar24 = vmaxps_avx(auVar26,auVar24);
      auVar26 = vfmadd213ps_avx512vl(auVar25,auVar51._0_16_,auVar57._0_16_);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar15 ^ 0x10)),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar15 ^ 0x10)));
      auVar26 = vminps_avx512vl(auVar55._0_16_,auVar26);
      auVar27 = vfmadd213ps_avx512vl(auVar25,auVar52._0_16_,auVar58._0_16_);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar21 ^ 0x10)),auVar37,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar21 ^ 0x10)));
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar53._0_16_,auVar59._0_16_);
      auVar25 = vminps_avx(auVar27,auVar25);
      auVar25 = vminps_avx(auVar26,auVar25);
      uVar7 = vcmpps_avx512vl(auVar24,auVar25,2);
      uVar17 = (uint)uVar7;
      if (((uint)sVar20 & 7) == 6) {
        uVar8 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
        uVar9 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [16])(uVar13 + 0xe0),0xd);
        uVar17 = (uint)(byte)((byte)uVar8 & (byte)uVar9 & (byte)uVar7);
      }
      if ((byte)uVar17 == 0) goto LAB_01cbd6a8;
      lVar14 = 0;
      for (uVar18 = (ulong)(byte)uVar17; (uVar18 & 1) == 0;
          uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      sVar20 = *(size_t *)(uVar13 + lVar14 * 8);
      uVar17 = (uVar17 & 0xff) - 1 & uVar17 & 0xff;
      uVar18 = (ulong)uVar17;
      if (uVar17 != 0) {
        do {
          local_a50->ptr = sVar20;
          local_a50 = local_a50 + 1;
          lVar14 = 0;
          for (uVar11 = uVar18; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          sVar20 = *(size_t *)(uVar13 + lVar14 * 8);
        } while (uVar18 != 0);
      }
    }
    local_a00 = (ulong)((uint)sVar20 & 0xf) - 8;
    uVar13 = sVar20 & 0xfffffffffffffff0;
    for (local_a08 = 0; local_a08 != local_a00; local_a08 = local_a08 + 1) {
      lVar14 = local_a08 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar28._4_4_ = uVar1;
      auVar28._0_4_ = uVar1;
      auVar28._8_4_ = uVar1;
      auVar28._12_4_ = uVar1;
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x90 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + lVar14));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xa0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x10 + lVar14));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xb0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + lVar14));
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xc0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x30 + lVar14));
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xd0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x40 + lVar14));
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xe0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x50 + lVar14));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xf0 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x60 + lVar14));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x100 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x70 + lVar14));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x110 + lVar14),auVar28,
                                *(undefined1 (*) [16])(uVar13 + 0x80 + lVar14));
      auVar24 = vsubps_avx(auVar31,auVar24);
      auVar25 = vsubps_avx(auVar32,auVar25);
      auVar26 = vsubps_avx(auVar33,auVar26);
      auVar27 = vsubps_avx(auVar27,auVar31);
      auVar38 = vsubps_avx(auVar38,auVar32);
      auVar37 = vsubps_avx(auVar37,auVar33);
      auVar29._0_4_ = auVar25._0_4_ * auVar37._0_4_;
      auVar29._4_4_ = auVar25._4_4_ * auVar37._4_4_;
      auVar29._8_4_ = auVar25._8_4_ * auVar37._8_4_;
      auVar29._12_4_ = auVar25._12_4_ * auVar37._12_4_;
      local_898 = vfmsub231ps_fma(auVar29,auVar38,auVar26);
      auVar34._0_4_ = auVar26._0_4_ * auVar27._0_4_;
      auVar34._4_4_ = auVar26._4_4_ * auVar27._4_4_;
      auVar34._8_4_ = auVar26._8_4_ * auVar27._8_4_;
      auVar34._12_4_ = auVar26._12_4_ * auVar27._12_4_;
      local_888 = vfmsub231ps_fma(auVar34,auVar37,auVar24);
      auVar35._0_4_ = auVar24._0_4_ * auVar38._0_4_;
      auVar35._4_4_ = auVar24._4_4_ * auVar38._4_4_;
      auVar35._8_4_ = auVar24._8_4_ * auVar38._8_4_;
      auVar35._12_4_ = auVar24._12_4_ * auVar38._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar36._4_4_ = uVar1;
      auVar36._0_4_ = uVar1;
      auVar36._8_4_ = uVar1;
      auVar36._12_4_ = uVar1;
      auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar30._4_4_ = uVar1;
      auVar30._0_4_ = uVar1;
      auVar30._8_4_ = uVar1;
      auVar30._12_4_ = uVar1;
      auVar30 = vsubps_avx512vl(auVar31,auVar30);
      local_878 = vfmsub231ps_fma(auVar35,auVar27,auVar25);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar31._4_4_ = uVar1;
      auVar31._0_4_ = uVar1;
      auVar31._8_4_ = uVar1;
      auVar31._12_4_ = uVar1;
      auVar31 = vsubps_avx512vl(auVar32,auVar31);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      auVar32 = vsubps_avx512vl(auVar33,auVar32);
      auVar33 = vmulps_avx512vl(auVar28,auVar32);
      auVar33 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar29);
      auVar34 = vmulps_avx512vl(auVar29,auVar30);
      auVar34 = vfmsub231ps_avx512vl(auVar34,auVar32,auVar36);
      auVar35 = vmulps_avx512vl(auVar36,auVar31);
      auVar35 = vfmsub231ps_avx512vl(auVar35,auVar30,auVar28);
      auVar29 = vmulps_avx512vl(local_878,auVar29);
      auVar28 = vfmadd231ps_avx512vl(auVar29,local_888,auVar28);
      auVar28 = vfmadd231ps_avx512vl(auVar28,local_898,auVar36);
      auVar29 = vandps_avx512vl(auVar28,auVar61._0_16_);
      auVar36 = vandps_avx512vl(auVar28,auVar56._0_16_);
      auVar37 = vmulps_avx512vl(auVar37,auVar35);
      auVar38 = vfmadd231ps_avx512vl(auVar37,auVar34,auVar38);
      auVar27 = vfmadd231ps_fma(auVar38,auVar33,auVar27);
      uVar17 = auVar36._0_4_;
      auVar44._0_4_ = (float)(uVar17 ^ auVar27._0_4_);
      uVar48 = auVar36._4_4_;
      auVar44._4_4_ = (float)(uVar48 ^ auVar27._4_4_);
      uVar49 = auVar36._8_4_;
      auVar44._8_4_ = (float)(uVar49 ^ auVar27._8_4_);
      uVar50 = auVar36._12_4_;
      auVar44._12_4_ = (float)(uVar50 ^ auVar27._12_4_);
      auVar26 = vmulps_avx512vl(auVar26,auVar35);
      auVar25 = vfmadd231ps_avx512vl(auVar26,auVar25,auVar34);
      auVar24 = vfmadd231ps_fma(auVar25,auVar24,auVar33);
      auVar25._0_4_ = (float)(uVar17 ^ auVar24._0_4_);
      auVar25._4_4_ = (float)(uVar48 ^ auVar24._4_4_);
      auVar25._8_4_ = (float)(uVar49 ^ auVar24._8_4_);
      auVar25._12_4_ = (float)(uVar50 ^ auVar24._12_4_);
      auVar24 = auVar62._0_16_;
      uVar7 = vcmpps_avx512vl(auVar44,auVar24,5);
      uVar8 = vcmpps_avx512vl(auVar25,auVar24,5);
      uVar9 = vcmpps_avx512vl(auVar28,auVar24,4);
      auVar24._0_4_ = auVar44._0_4_ + auVar25._0_4_;
      auVar24._4_4_ = auVar44._4_4_ + auVar25._4_4_;
      auVar24._8_4_ = auVar44._8_4_ + auVar25._8_4_;
      auVar24._12_4_ = auVar44._12_4_ + auVar25._12_4_;
      uVar10 = vcmpps_avx512vl(auVar24,auVar29,2);
      bVar22 = (byte)uVar7 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
      if (bVar22 != 0) {
        auVar46._0_4_ = auVar32._0_4_ * local_878._0_4_;
        auVar46._4_4_ = auVar32._4_4_ * local_878._4_4_;
        auVar46._8_4_ = auVar32._8_4_ * local_878._8_4_;
        auVar46._12_4_ = auVar32._12_4_ * local_878._12_4_;
        auVar24 = vfmadd213ps_fma(auVar31,local_888,auVar46);
        auVar24 = vfmadd213ps_fma(auVar30,local_898,auVar24);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar33._4_4_ = uVar1;
        auVar33._0_4_ = uVar1;
        auVar33._8_4_ = uVar1;
        auVar33._12_4_ = uVar1;
        auVar26 = vmulps_avx512vl(auVar29,auVar33);
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar45._0_4_ = (float)(uVar17 ^ auVar24._0_4_);
        auVar45._4_4_ = (float)(uVar48 ^ auVar24._4_4_);
        auVar45._8_4_ = (float)(uVar49 ^ auVar24._8_4_);
        auVar45._12_4_ = (float)(uVar50 ^ auVar24._12_4_);
        auVar47._0_4_ = fVar2 * auVar29._0_4_;
        auVar47._4_4_ = fVar2 * auVar29._4_4_;
        auVar47._8_4_ = fVar2 * auVar29._8_4_;
        auVar47._12_4_ = fVar2 * auVar29._12_4_;
        uVar7 = vcmpps_avx512vl(auVar45,auVar47,2);
        uVar8 = vcmpps_avx512vl(auVar26,auVar45,1);
        bVar22 = (byte)uVar7 & (byte)uVar8 & bVar22;
        if (bVar22 != 0) {
          local_9f0 = context->scene;
          auVar24 = vrcp14ps_avx512vl(auVar29);
          auVar12._8_4_ = 0x3f800000;
          auVar12._0_8_ = 0x3f8000003f800000;
          auVar12._12_4_ = 0x3f800000;
          auVar26 = vfnmadd213ps_avx512vl(auVar29,auVar24,auVar12);
          auVar24 = vfmadd132ps_fma(auVar26,auVar24,auVar24);
          fVar40 = auVar24._0_4_;
          fVar41 = auVar24._4_4_;
          fVar42 = auVar24._8_4_;
          fVar43 = auVar24._12_4_;
          local_8a8[0] = fVar40 * auVar45._0_4_;
          local_8a8[1] = fVar41 * auVar45._4_4_;
          local_8a8[2] = fVar42 * auVar45._8_4_;
          local_8a8[3] = fVar43 * auVar45._12_4_;
          local_8c8[0] = fVar40 * auVar44._0_4_;
          local_8c8[1] = fVar41 * auVar44._4_4_;
          local_8c8[2] = fVar42 * auVar44._8_4_;
          local_8c8[3] = fVar43 * auVar44._12_4_;
          local_8b8._0_4_ = fVar40 * auVar25._0_4_;
          local_8b8._4_4_ = fVar41 * auVar25._4_4_;
          local_8b8._8_4_ = fVar42 * auVar25._8_4_;
          local_8b8._12_4_ = fVar43 * auVar25._12_4_;
          uVar18 = (ulong)bVar22;
          do {
            auVar24 = auVar62._0_16_;
            uVar11 = 0;
            for (uVar23 = uVar18; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              uVar11 = uVar11 + 1;
            }
            pGVar4 = (local_9f0->geometries).items[*(uint *)(lVar14 + uVar13 + 0x120 + uVar11 * 4)].
                     ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cbde3e:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01cbde4a;
              }
              uVar23 = (ulong)(uint)((int)uVar11 * 4);
              uVar1 = *(undefined4 *)((long)local_8c8 + uVar23);
              local_838._4_4_ = uVar1;
              local_838._0_4_ = uVar1;
              local_838._8_4_ = uVar1;
              local_838._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_8b8 + uVar23);
              local_828._4_4_ = uVar1;
              local_828._0_4_ = uVar1;
              local_828._8_4_ = uVar1;
              local_828._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_8a8 + uVar23);
              args.context = context->user;
              local_808 = vpbroadcastd_avx512vl();
              uVar1 = *(undefined4 *)(lVar14 + uVar13 + 0x130 + uVar23);
              local_818._4_4_ = uVar1;
              local_818._0_4_ = uVar1;
              local_818._8_4_ = uVar1;
              local_818._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_898 + uVar23);
              uVar3 = *(undefined4 *)(local_888 + uVar23);
              local_858._4_4_ = uVar3;
              local_858._0_4_ = uVar3;
              local_858._8_4_ = uVar3;
              local_858._12_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_878 + uVar23);
              local_848._4_4_ = uVar3;
              local_848._0_4_ = uVar3;
              local_848._8_4_ = uVar3;
              local_848._12_4_ = uVar3;
              local_868[0] = (RTCHitN)(char)uVar1;
              local_868[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_868[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_868[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_868[4] = (RTCHitN)(char)uVar1;
              local_868[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_868[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_868[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_868[8] = (RTCHitN)(char)uVar1;
              local_868[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_868[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_868[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_868[0xc] = (RTCHitN)(char)uVar1;
              local_868[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_868[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_868[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
              uStack_7f4 = (args.context)->instID[0];
              local_7f8 = uStack_7f4;
              uStack_7f0 = uStack_7f4;
              uStack_7ec = uStack_7f4;
              uStack_7e8 = (args.context)->instPrimID[0];
              uStack_7e4 = uStack_7e8;
              uStack_7e0 = uStack_7e8;
              uStack_7dc = uStack_7e8;
              auVar26 = auVar60._0_16_;
              local_a18 = vmovdqa64_avx512vl(auVar26);
              args.valid = (int *)local_a18;
              args.geometryUserPtr = pGVar4->userPtr;
              args.hit = local_868;
              args.N = 4;
              auVar25 = vmovdqa64_avx512vl(auVar26);
              auVar26 = vmovdqa64_avx512vl(auVar26);
              args.ray = (RTCRayN *)ray;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
                auVar26 = local_a18;
              }
              uVar23 = vptestmd_avx512vl(auVar26,auVar26);
              if ((uVar23 & 0xf) != 0) {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar26 = local_a18;
                }
                uVar23 = vptestmd_avx512vl(auVar26,auVar26);
                uVar23 = uVar23 & 0xf;
                auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar6 = (bool)((byte)uVar23 & 1);
                auVar39._0_4_ =
                     (uint)bVar6 * auVar26._0_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x80);
                bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
                auVar39._4_4_ =
                     (uint)bVar6 * auVar26._4_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x84);
                bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
                auVar39._8_4_ =
                     (uint)bVar6 * auVar26._8_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x88);
                bVar6 = SUB81(uVar23 >> 3,0);
                auVar39._12_4_ =
                     (uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar39;
                if ((byte)uVar23 != 0) goto LAB_01cbde3e;
              }
              *(float *)(ray + k * 4 + 0x80) = fVar2;
              auVar51 = ZEXT1664(auVar51._0_16_);
              auVar52 = ZEXT1664(auVar52._0_16_);
              auVar53 = ZEXT1664(auVar53._0_16_);
              auVar54 = ZEXT1664(auVar54._0_16_);
              auVar55 = ZEXT1664(auVar55._0_16_);
              auVar26 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar56 = ZEXT1664(auVar26);
              auVar57 = ZEXT1664(auVar57._0_16_);
              auVar58 = ZEXT1664(auVar58._0_16_);
              auVar59 = ZEXT1664(auVar59._0_16_);
              auVar25 = vmovdqa64_avx512vl(auVar25);
              auVar60 = ZEXT1664(auVar25);
              auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar61 = ZEXT1664(auVar25);
              auVar24 = vxorps_avx512vl(auVar24,auVar24);
              auVar62 = ZEXT1664(auVar24);
            }
            uVar18 = uVar18 ^ 1L << (uVar11 & 0x3f);
          } while (uVar18 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }